

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int64_t advance_file_pointer(archive_read_filter *filter,int64_t request)

{
  int iVar1;
  int64_t iVar2;
  size_t sVar3;
  size_t local_50;
  size_t local_48;
  size_t min;
  ssize_t bytes_read;
  int64_t total_bytes_skipped;
  int64_t bytes_skipped;
  int64_t request_local;
  archive_read_filter *filter_local;
  
  bytes_read = 0;
  if (filter->fatal == '\0') {
    bytes_skipped = request;
    if (filter->avail != 0) {
      local_48 = request;
      if ((long)filter->avail <= request) {
        local_48 = filter->avail;
      }
      filter->next = filter->next + local_48;
      filter->avail = filter->avail - local_48;
      bytes_skipped = request - local_48;
      filter->position = local_48 + filter->position;
      bytes_read = local_48;
    }
    if (filter->client_avail != 0) {
      if (bytes_skipped < (long)filter->client_avail) {
        local_50 = bytes_skipped;
      }
      else {
        local_50 = filter->client_avail;
      }
      filter->client_next = filter->client_next + local_50;
      filter->client_avail = filter->client_avail - local_50;
      bytes_skipped = bytes_skipped - local_50;
      filter->position = local_50 + filter->position;
      bytes_read = local_50 + bytes_read;
    }
    if (bytes_skipped == 0) {
      filter_local = (archive_read_filter *)bytes_read;
    }
    else {
      if (filter->skip != (_func_int64_t_archive_read_filter_ptr_int64_t *)0x0) {
        iVar2 = (*filter->skip)(filter,bytes_skipped);
        if (iVar2 < 0) {
          filter->fatal = '\x01';
          return iVar2;
        }
        filter->position = iVar2 + filter->position;
        bytes_read = iVar2 + bytes_read;
        bytes_skipped = bytes_skipped - iVar2;
        if (bytes_skipped == 0) {
          return bytes_read;
        }
      }
      do {
        while( true ) {
          sVar3 = (*filter->read)(filter,&filter->client_buff);
          if ((long)sVar3 < 0) {
            filter->client_buff = (void *)0x0;
            filter->fatal = '\x01';
            return sVar3;
          }
          if (sVar3 == 0) break;
          if (bytes_skipped <= (long)sVar3) {
            filter->client_next = (char *)((long)filter->client_buff + bytes_skipped);
            filter->client_avail = sVar3 - bytes_skipped;
            filter->client_total = sVar3;
            filter->position = bytes_skipped + filter->position;
            return bytes_skipped + bytes_read;
          }
          filter->position = sVar3 + filter->position;
          bytes_read = sVar3 + bytes_read;
          bytes_skipped = bytes_skipped - sVar3;
        }
      } while (((filter->archive->client).cursor != (filter->archive->client).nodes - 1) &&
              (iVar1 = client_switch_proxy(filter,(filter->archive->client).cursor + 1), iVar1 == 0)
              );
      filter->client_buff = (void *)0x0;
      filter->end_of_file = '\x01';
      filter_local = (archive_read_filter *)bytes_read;
    }
  }
  else {
    filter_local = (archive_read_filter *)0xffffffffffffffff;
  }
  return (int64_t)filter_local;
}

Assistant:

static int64_t
advance_file_pointer(struct archive_read_filter *filter, int64_t request)
{
	int64_t bytes_skipped, total_bytes_skipped = 0;
	ssize_t bytes_read;
	size_t min;

	if (filter->fatal)
		return (-1);

	/* Use up the copy buffer first. */
	if (filter->avail > 0) {
		min = (size_t)minimum(request, (int64_t)filter->avail);
		filter->next += min;
		filter->avail -= min;
		request -= min;
		filter->position += min;
		total_bytes_skipped += min;
	}

	/* Then use up the client buffer. */
	if (filter->client_avail > 0) {
		min = (size_t)minimum(request, (int64_t)filter->client_avail);
		filter->client_next += min;
		filter->client_avail -= min;
		request -= min;
		filter->position += min;
		total_bytes_skipped += min;
	}
	if (request == 0)
		return (total_bytes_skipped);

	/* If there's an optimized skip function, use it. */
	if (filter->skip != NULL) {
		bytes_skipped = (filter->skip)(filter, request);
		if (bytes_skipped < 0) {	/* error */
			filter->fatal = 1;
			return (bytes_skipped);
		}
		filter->position += bytes_skipped;
		total_bytes_skipped += bytes_skipped;
		request -= bytes_skipped;
		if (request == 0)
			return (total_bytes_skipped);
	}

	/* Use ordinary reads as necessary to complete the request. */
	for (;;) {
		bytes_read = (filter->read)(filter, &filter->client_buff);
		if (bytes_read < 0) {
			filter->client_buff = NULL;
			filter->fatal = 1;
			return (bytes_read);
		}

		if (bytes_read == 0) {
			if (filter->archive->client.cursor !=
			      filter->archive->client.nodes - 1) {
				if (client_switch_proxy(filter,
				    filter->archive->client.cursor + 1)
				    == ARCHIVE_OK)
					continue;
			}
			filter->client_buff = NULL;
			filter->end_of_file = 1;
			return (total_bytes_skipped);
		}

		if (bytes_read >= request) {
			filter->client_next =
			    ((const char *)filter->client_buff) + request;
			filter->client_avail = (size_t)(bytes_read - request);
			filter->client_total = bytes_read;
			total_bytes_skipped += request;
			filter->position += request;
			return (total_bytes_skipped);
		}

		filter->position += bytes_read;
		total_bytes_skipped += bytes_read;
		request -= bytes_read;
	}
}